

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

int GetWindowSizeForHashChain(int quality,int xsize)

{
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  int max_window_size;
  int xsize_local;
  int quality_local;
  
  if (quality < 0x4c) {
    if (quality < 0x33) {
      if (quality < 0x1a) {
        local_18 = xsize << 4;
      }
      else {
        local_18 = xsize << 6;
      }
      local_14 = local_18;
    }
    else {
      local_14 = xsize << 8;
    }
    local_10 = local_14;
  }
  else {
    local_10 = 0xfff88;
  }
  if (local_10 < 0xfff89) {
    local_1c = local_10;
  }
  else {
    local_1c = 0xfff88;
  }
  return local_1c;
}

Assistant:

static int GetWindowSizeForHashChain(int quality, int xsize) {
  const int max_window_size = (quality > 75) ? WINDOW_SIZE
                            : (quality > 50) ? (xsize << 8)
                            : (quality > 25) ? (xsize << 6)
                            : (xsize << 4);
  assert(xsize > 0);
  return (max_window_size > WINDOW_SIZE) ? WINDOW_SIZE : max_window_size;
}